

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar5;
  appender aVar6;
  int iVar7;
  significand_type sVar8;
  int iVar9;
  ulong uVar10;
  char cVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  significand_type sVar15;
  ulong uVar16;
  size_t sVar17;
  char decimal_point;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_28_7_94dcc806 write;
  undefined1 local_d9 [9];
  sign_t local_d0;
  undefined1 local_cc [16];
  undefined1 local_bc [4];
  digit_grouping<char> local_b8;
  basic_format_specs<char> *local_90;
  long local_88;
  decimal_fp<float> *local_80;
  undefined1 local_78 [8];
  undefined1 local_70 [12];
  char cStack_64;
  undefined3 uStack_63;
  undefined8 local_60;
  decimal_fp<float> *local_58;
  digit_grouping<char> *local_50;
  digit_grouping<char> *local_48;
  int *local_40;
  int *local_38;
  
  uVar1 = fp->significand;
  uVar3 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar10 = (ulong)uVar1 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar3 * 8);
  uVar16 = uVar10 >> 0x20;
  iVar7 = (int)(uVar10 >> 0x20);
  uVar3 = fspecs._4_4_;
  local_d0 = uVar3 >> 8 & 0xff;
  local_d9._5_4_ = iVar7;
  local_cc._0_4_ = uVar1;
  local_78 = (undefined1  [8])fspecs;
  if ((long)uVar10 < 0) {
LAB_0013263a:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                ,0x182,"negative value");
  }
  lVar14 = (uVar16 + 1) - (ulong)(local_d0 == none);
  local_d9[0] = '.';
  if ((uVar3 >> 0x11 & 1) != 0) {
    local_cc._4_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    local_90 = specs;
    local_88 = lVar14;
    local_80 = fp;
    local_d9[0] = decimal_point_impl<char>(loc);
    specs = local_90;
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_cc._4_8_;
    fp = local_80;
    lVar14 = local_88;
  }
  uVar2 = fp->exponent;
  local_bc = (undefined1  [4])(uVar2 + iVar7);
  sVar15 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00132382:
    iVar9 = uVar2 + iVar7 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar10 = 0;
      if (iVar7 == 1) {
        local_d9[0] = '\0';
        uVar10 = 0;
      }
    }
    else {
      uVar10 = 0;
      if (0 < (int)(sVar15 - iVar7)) {
        uVar10 = (ulong)(sVar15 - iVar7);
      }
      lVar14 = lVar14 + uVar10;
    }
    local_70._0_8_ = CONCAT44(uVar1,uVar3 >> 8) & 0xffffffff000000ff;
    cStack_64 = local_d9[0];
    local_70._8_4_ = iVar7;
    local_60 = CONCAT35(local_60._5_3_,CONCAT14(((uVar3 >> 0x10 & 1) == 0) << 5,(int)uVar10)) |
               0x4500000000;
    local_58 = (decimal_fp<float> *)CONCAT44(local_58._4_4_,iVar9);
    if (0 < specs->width) {
      if ((int)local_bc < 1) {
        iVar9 = 1 - (int)local_bc;
      }
      lVar4 = 2;
      if (99 < iVar9) {
        lVar4 = (ulong)(999 < iVar9) + 3;
      }
      sVar17 = lVar14 + (3 - (ulong)(local_d9[0] == '\0')) + lVar4;
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,sVar17,sVar17,(anon_class_28_7_94dcc806 *)local_70);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    aVar6 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
            anon_class_28_7_94dcc806::operator()
                      ((anon_class_28_7_94dcc806 *)local_70,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    sVar8 = 0x10;
    if (0 < (int)sVar15) {
      sVar8 = sVar15;
    }
    if (((int)local_bc < -3) || ((int)sVar8 < (int)local_bc)) goto LAB_00132382;
  }
  if ((int)uVar2 < 0) {
    if ((int)local_bc < 1) {
      sVar8 = -(int)local_bc;
      local_b8.sep_.grouping._M_dataplus._M_p._0_4_ = sVar8;
      if (SBORROW4(sVar15,sVar8) != (int)(sVar15 + (int)local_bc) < 0) {
        local_b8.sep_.grouping._M_dataplus._M_p._0_4_ = sVar15;
      }
      if ((int)sVar15 < 0) {
        local_b8.sep_.grouping._M_dataplus._M_p._0_4_ = sVar8;
      }
      if (uVar16 != 0) {
        local_b8.sep_.grouping._M_dataplus._M_p._0_4_ = sVar8;
      }
      if (local_b8.sep_.grouping._M_dataplus._M_p._0_4_ == 0 && uVar16 == 0) {
        local_d9[1] = (char)((uVar3 & 0x100000) >> 0x14);
        iVar7 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_d9[1] = 1;
        iVar7 = 2;
        if ((int)local_b8.sep_.grouping._M_dataplus._M_p._0_4_ < 0) goto LAB_0013263a;
      }
      sVar17 = lVar14 + (ulong)(uint)(iVar7 + local_b8.sep_.grouping._M_dataplus._M_p._0_4_);
      local_70._0_8_ = &local_d0;
      unique0x00004e80 = local_d9 + 1;
      local_60 = local_d9;
      local_58 = (decimal_fp<float> *)&local_b8;
      local_50 = (digit_grouping<char> *)local_cc;
      local_48 = (digit_grouping<char> *)(local_d9 + 5);
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                        (out,specs,sVar17,sVar17,(anon_class_48_6_d9b5e731 *)local_70);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    iVar9 = 0;
    local_d9._1_4_ = sVar15 - iVar7 & (int)(uVar3 << 0xb) >> 0x1f;
    uVar1 = local_d9._1_4_;
    if ((int)local_d9._1_4_ < 1) {
      uVar1 = 0;
    }
    local_cc._4_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    digit_grouping<char>::digit_grouping(&local_b8,loc,(bool)((byte)(uVar3 >> 0x11) & 1));
    if (local_b8.sep_.thousands_sep != '\0') {
      pcVar12 = (char *)CONCAT44(local_b8.sep_.grouping._M_dataplus._M_p._4_4_,
                                 local_b8.sep_.grouping._M_dataplus._M_p._0_4_);
      pcVar13 = pcVar12 + local_b8.sep_.grouping._M_string_length;
      lVar4 = 0;
      do {
        if (pcVar12 == pcVar13) {
          cVar11 = pcVar13[-1];
          pcVar12 = pcVar13;
        }
        else {
          cVar11 = *pcVar12;
          if ((byte)(cVar11 + 0x81U) < 0x82) goto LAB_00132654;
          pcVar12 = pcVar12 + 1;
        }
        iVar9 = iVar9 + cVar11;
        if ((int)local_d9._5_4_ <= iVar9) goto LAB_00132654;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_00132654:
    sVar17 = lVar14 + (ulong)uVar1 + 1 + lVar4;
    local_70._0_8_ = &local_d0;
    unique0x00004e80 = local_cc;
    local_60 = local_d9 + 5;
    local_58 = (decimal_fp<float> *)(local_cc + 0x10);
    local_50 = (digit_grouping<char> *)local_d9;
    local_40 = (int *)(local_d9 + 1);
    local_48 = &local_b8;
    bVar5.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                   ((appender)local_cc._4_8_,specs,sVar17,sVar17,
                    (anon_class_56_7_aadf885c *)local_70);
    goto LAB_001326a8;
  }
  lVar14 = lVar14 + (ulong)uVar2;
  local_d9._1_4_ = sVar15 - (int)local_bc;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_d9._1_4_) {
      if ((int)local_d9._1_4_ < 1) goto LAB_00132536;
    }
    else {
      local_d9._1_4_ = 1;
    }
    lVar14 = lVar14 + (ulong)(uint)local_d9._1_4_ + 1;
  }
LAB_00132536:
  digit_grouping<char>::digit_grouping(&local_b8,loc,(bool)((byte)(uVar3 >> 0x11) & 1));
  iVar7 = 0;
  if (local_b8.sep_.thousands_sep != '\0') {
    pcVar12 = (char *)CONCAT44(local_b8.sep_.grouping._M_dataplus._M_p._4_4_,
                               local_b8.sep_.grouping._M_dataplus._M_p._0_4_);
    pcVar13 = pcVar12 + local_b8.sep_.grouping._M_string_length;
    lVar4 = 0;
    do {
      if (pcVar12 == pcVar13) {
        cVar11 = pcVar13[-1];
        pcVar12 = pcVar13;
      }
      else {
        cVar11 = *pcVar12;
        if ((byte)(cVar11 + 0x81U) < 0x82) goto LAB_001325a3;
        pcVar12 = pcVar12 + 1;
      }
      iVar7 = iVar7 + cVar11;
      if ((int)local_d9._5_4_ <= iVar7) goto LAB_001325a3;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 0;
LAB_001325a3:
  local_70._0_8_ = &local_d0;
  unique0x00004e80 = local_cc;
  local_60 = local_d9 + 5;
  local_48 = (digit_grouping<char> *)local_78;
  local_40 = (int *)local_d9;
  local_38 = (int *)(local_d9 + 1);
  local_58 = fp;
  local_50 = &local_b8;
  bVar5.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                 (out,specs,lVar14 + lVar4,lVar14 + lVar4,(anon_class_64_8_b997adb5 *)local_70);
LAB_001326a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8.sep_.grouping._M_dataplus._M_p._4_4_,
                  local_b8.sep_.grouping._M_dataplus._M_p._0_4_) != &local_b8.sep_.grouping.field_2)
  {
    operator_delete((undefined1 *)
                    CONCAT44(local_b8.sep_.grouping._M_dataplus._M_p._4_4_,
                             local_b8.sep_.grouping._M_dataplus._M_p._0_4_),
                    local_b8.sep_.grouping.field_2._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar5.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 locale_ref loc) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}